

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWec.h
# Opt level: O0

void Vec_WecRemoveEmpty(Vec_Wec_t *vCubes)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  Vec_Int_t *pVVar3;
  int local_20;
  int local_1c;
  int k;
  int i;
  Vec_Int_t *vCube;
  Vec_Wec_t *vCubes_local;
  
  local_20 = 0;
  for (local_1c = 0; iVar1 = Vec_WecSize(vCubes), local_1c < iVar1; local_1c = local_1c + 1) {
    pVVar2 = Vec_WecEntry(vCubes,local_1c);
    iVar1 = Vec_IntSize(pVVar2);
    if (iVar1 < 1) {
      if (pVVar2->pArray != (int *)0x0) {
        free(pVVar2->pArray);
        pVVar2->pArray = (int *)0x0;
      }
    }
    else {
      pVVar3 = vCubes->pArray + local_20;
      iVar1 = pVVar2->nSize;
      pVVar3->nCap = pVVar2->nCap;
      pVVar3->nSize = iVar1;
      pVVar3->pArray = pVVar2->pArray;
      local_20 = local_20 + 1;
    }
  }
  for (local_1c = local_20; iVar1 = Vec_WecSize(vCubes), local_1c < iVar1; local_1c = local_1c + 1)
  {
    pVVar2 = Vec_WecEntry(vCubes,local_1c);
    Vec_IntZero(pVVar2);
  }
  Vec_WecShrink(vCubes,local_20);
  return;
}

Assistant:

static inline void Vec_WecRemoveEmpty( Vec_Wec_t * vCubes )
{
    Vec_Int_t * vCube;
    int i, k = 0;
    Vec_WecForEachLevel( vCubes, vCube, i )
        if ( Vec_IntSize(vCube) > 0 )
            vCubes->pArray[k++] = *vCube;
        else
            ABC_FREE( vCube->pArray );
    for ( i = k; i < Vec_WecSize(vCubes); i++ )
        Vec_IntZero( Vec_WecEntry(vCubes, i) );
    Vec_WecShrink( vCubes, k );
//    Vec_WecSortByFirstInt( vCubes, 0 );
}